

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_wrapper.cpp
# Opt level: O1

ssize_t __thiscall
YAML::ostream_wrapper::write(ostream_wrapper *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  long *plVar6;
  ulong __new_size;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  string *__range1;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,__fd);
  if (this->m_pStream == (ostream *)0x0) {
    __new_size = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
    uVar5 = this->m_pos + plVar6[1] + 1;
    if (__new_size <= uVar5) {
      __new_size = uVar5;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,__new_size);
    if (plVar6[1] != 0) {
      memmove((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + this->m_pos,(void *)*plVar6,plVar6[1]);
    }
  }
  else {
    std::ostream::write((char *)this->m_pStream,*plVar6);
  }
  lVar2 = plVar6[1];
  if (lVar2 != 0) {
    lVar3 = *plVar6;
    sVar9 = this->m_col;
    sVar4 = this->m_pos;
    sVar7 = this->m_row;
    lVar8 = 0;
    do {
      cVar1 = *(char *)(lVar3 + lVar8);
      this->m_pos = sVar4 + 1 + lVar8;
      sVar9 = sVar9 + 1;
      this->m_col = sVar9;
      if (cVar1 == '\n') {
        sVar7 = sVar7 + 1;
        this->m_row = sVar7;
        this->m_col = 0;
        this->m_comment = false;
        sVar9 = 0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar2 != lVar8);
  }
  return lVar2;
}

Assistant:

void ostream_wrapper::write(const std::string& str) {
  if (m_pStream) {
    m_pStream->write(str.c_str(), str.size());
  } else {
    m_buffer.resize(std::max(m_buffer.size(), m_pos + str.size() + 1));
    std::copy(str.begin(), str.end(), m_buffer.begin() + m_pos);
  }

  for (char ch : str) {
    update_pos(ch);
  }
}